

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::UdpEdgeIndicatorSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,UdpEdgeIndicatorSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  size_t index_local;
  UdpEdgeIndicatorSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openParen).kind;
    token._2_1_ = (this->openParen).field_0x2;
    token.numFlags.raw = (this->openParen).numFlags.raw;
    token.rawLen = (this->openParen).rawLen;
    token.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->first).kind;
    token_00._2_1_ = (this->first).field_0x2;
    token_00.numFlags.raw = (this->first).numFlags.raw;
    token_00.rawLen = (this->first).rawLen;
    token_00.info = (this->first).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    token_01.kind = (this->second).kind;
    token_01._2_1_ = (this->second).field_0x2;
    token_01.numFlags.raw = (this->second).numFlags.raw;
    token_01.rawLen = (this->second).rawLen;
    token_01.info = (this->second).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 3:
    token_02.kind = (this->closeParen).kind;
    token_02._2_1_ = (this->closeParen).field_0x2;
    token_02.numFlags.raw = (this->closeParen).numFlags.raw;
    token_02.rawLen = (this->closeParen).rawLen;
    token_02.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax UdpEdgeIndicatorSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openParen;
        case 1: return first;
        case 2: return second;
        case 3: return closeParen;
        default: return nullptr;
    }
}